

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClrDirWrapper.cpp
# Opt level: O0

QString * __thiscall
ClrDirWrapper::translateFieldContent
          (QString *__return_storage_ptr__,ClrDirWrapper *this,size_t fieldId)

{
  bool bVar1;
  IMAGE_COR20_HEADER *pIVar2;
  reference puVar3;
  qsizetype qVar4;
  QString local_d0;
  undefined4 local_b8;
  undefined1 local_a8 [8];
  QString flagInfo;
  iterator iStack_88;
  DWORD nextFlag;
  _Base_ptr local_80;
  undefined1 local_78 [8];
  QStringList list;
  iterator itr;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> flagsSet;
  IMAGE_COR20_HEADER *d;
  size_t fieldId_local;
  ClrDirWrapper *this_local;
  
  pIVar2 = clrDir(this);
  if (pIVar2 == (IMAGE_COR20_HEADER *)0x0) {
    QString::QString(__return_storage_ptr__,"");
  }
  else if (fieldId == 5) {
    getFlagsSet((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&itr,
                pIVar2->Flags);
    std::_Rb_tree_const_iterator<unsigned_int>::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<unsigned_int> *)&list.d.size);
    QList<QString>::QList((QList<QString> *)local_78);
    local_80 = (_Base_ptr)
               std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                         ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&itr);
    list.d.size = (qsizetype)local_80;
    while( true ) {
      iStack_88 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &itr);
      bVar1 = std::operator!=((_Self *)&list.d.size,&stack0xffffffffffffff78);
      if (!bVar1) break;
      puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                         ((_Rb_tree_const_iterator<unsigned_int> *)&list.d.size);
      flagInfo.d.size._4_4_ = *puVar3;
      translateFlag((QString *)local_a8,flagInfo.d.size._4_4_);
      qVar4 = QString::length((QString *)local_a8);
      if (qVar4 == 0) {
        local_b8 = 4;
      }
      else {
        QList<QString>::append((QList<QString> *)local_78,(parameter_type)local_a8);
        local_b8 = 0;
      }
      QString::~QString((QString *)local_a8);
      std::_Rb_tree_const_iterator<unsigned_int>::operator++
                ((_Rb_tree_const_iterator<unsigned_int> *)&list.d.size);
    }
    QString::QString(&local_d0,";");
    QListSpecialMethods<QString>::join
              (__return_storage_ptr__,(QListSpecialMethods<QString> *)local_78,&local_d0);
    QString::~QString(&local_d0);
    local_b8 = 1;
    QList<QString>::~QList((QList<QString> *)local_78);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&itr);
  }
  else {
    QString::QString(__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

QString ClrDirWrapper::translateFieldContent(size_t fieldId)
{
    const pe::IMAGE_COR20_HEADER* d = clrDir();
    if (!d) return "";
    
    if (fieldId != FLAGS) return "";
    
    std::set<DWORD> flagsSet = ClrDirWrapper::getFlagsSet(d->Flags);
    std::set<DWORD>::iterator itr;
    QStringList list;
    for (itr = flagsSet.begin() ; itr != flagsSet.end(); ++itr) {
        const DWORD nextFlag = *itr;
        const QString flagInfo = ClrDirWrapper::translateFlag(nextFlag);
        if (flagInfo.length() == 0) continue;
        list.append(flagInfo);
    }
    return list.join(";");
}